

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void ClearHuffmanTreeIfOnlyOneSymbol(HuffmanTreeCode *huffman_code)

{
  int count;
  int k;
  HuffmanTreeCode *huffman_code_local;
  
  count = 0;
  k = 0;
  while( true ) {
    if (huffman_code->num_symbols <= k) {
      for (k = 0; k < huffman_code->num_symbols; k = k + 1) {
        huffman_code->code_lengths[k] = '\0';
        huffman_code->codes[k] = 0;
      }
      return;
    }
    if ((huffman_code->code_lengths[k] != '\0') && (count = count + 1, 1 < count)) break;
    k = k + 1;
  }
  return;
}

Assistant:

static void ClearHuffmanTreeIfOnlyOneSymbol(
    HuffmanTreeCode* const huffman_code) {
  int k;
  int count = 0;
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    if (huffman_code->code_lengths[k] != 0) {
      ++count;
      if (count > 1) return;
    }
  }
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    huffman_code->code_lengths[k] = 0;
    huffman_code->codes[k] = 0;
  }
}